

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::MpRepeatedString<false>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  unsigned_long v1;
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  __int_type_conflict3 _Var4;
  __pointer_type pSVar5;
  bool bVar6;
  uint uVar7;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  char *pcVar8;
  Rep *pRVar9;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar10;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 s;
  Nonnull<const_char_*> failure_msg;
  string *s_00;
  ulong uVar11;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 *this;
  uint uVar12;
  long extraout_RDX;
  long lVar13;
  ParseContext *extraout_RDX_00;
  ParseContext *ctx_00;
  ParseContext *extraout_RDX_01;
  ParseContext *extraout_RDX_02;
  ParseContext *extraout_RDX_03;
  uint uVar14;
  ushort *puVar15;
  unsigned_long v2;
  ushort *puVar16;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 table_00;
  uint *puVar17;
  uint64_t uVar18;
  SerialArena *unaff_R13;
  ushort *puVar19;
  long in_FS_OFFSET;
  pair<const_char_*,_unsigned_int> pVar20;
  string_view wire_bytes;
  string_view str;
  string_view wire_bytes_00;
  LogMessage local_40;
  
  table_00.data = (long)&table->has_bits_offset + ((ulong)data.field_0 >> 0x20);
  if ((table_00.data & 3) != 0) goto LAB_0028ed8d;
  uVar7 = data.field_0._0_4_;
  if ((uVar7 & 7) != 2) {
    UNRECOVERED_JUMPTABLE = table->fallback;
    goto LAB_0028ea7c;
  }
  uVar14 = *(ushort *)(table_00.data + 10) & 0x1c0;
  if (uVar14 != 0x100) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
               ,0x9b7);
    str._M_str = "Unsupported repeated string rep: ";
    str._M_len = 0x21;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&local_40,str);
    absl::lts_20250127::log_internal::LogMessage::operator<<(&local_40,(unsigned_short)uVar14);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_40);
  }
  this = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
         ((long)&msg->_vptr_MessageLite + (ulong)*(uint *)table_00);
  if (((ulong)this & 7) != 0) {
    AlignFail(this);
  }
  uVar14 = *(ushort *)(table_00.data + 10) & 0x600;
  s = (anon_union_8_1_898a9ca8_for_TcFieldData_0)this[2].data;
  uVar18 = hasbits;
  puVar19 = (ushort *)ptr;
  if (((long *)s.data == (long *)0x0) ||
     (lVar13 = *(long *)(in_FS_OFFSET + -0x78), lVar13 != *(long *)s)) {
LAB_0028ec47:
    do {
      s_00 = (string *)RepeatedPtrFieldBase::AddString((RepeatedPtrFieldBase *)this);
      puVar16 = puVar19;
      ptr = InlineGreedyStringParser(s_00,(char *)puVar19,ctx);
      ctx_00 = extraout_RDX_02;
      if ((ushort *)ptr == (ushort *)0x0) goto LAB_0028ed6b;
      puVar16 = (ushort *)(s_00->_M_dataplus)._M_p;
      wire_bytes_00._M_str = (char *)table;
      wire_bytes_00._M_len = (size_t)puVar16;
      s.data = table_00.data;
      bVar6 = MpVerifyUtf8((TcParser *)s_00->_M_string_length,wire_bytes_00,
                           (TcParseTableBase *)table_00,(FieldEntry *)(ulong)uVar14,(uint16_t)uVar18
                          );
      ctx_00 = extraout_RDX_03;
      if (!bVar6) goto LAB_0028ed6b;
      puVar16 = (ushort *)(ctx->super_EpsCopyInputStream).limit_end_;
      bVar6 = ptr < puVar16;
      if (ptr < puVar16) {
        bVar1 = (byte)*(ushort *)ptr;
        unaff_R13 = (SerialArena *)(ulong)bVar1;
        puVar19 = (ushort *)((long)ptr + 1);
        if ((char)bVar1 < '\0') {
          bVar2 = *(byte *)puVar19;
          s.data = (ulong)bVar2 << 7;
          uVar12 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
          unaff_R13 = (SerialArena *)(ulong)uVar12;
          if ((char)bVar2 < '\0') {
            pVar20 = ReadTagFallback(ptr,uVar12);
            puVar19 = (ushort *)pVar20.first;
            unaff_R13 = (SerialArena *)(ulong)pVar20.second;
          }
          else {
            puVar19 = (ushort *)((long)ptr + 2);
          }
        }
      }
    } while ((ptr < puVar16) && ((uint)unaff_R13 == uVar7));
  }
  else {
    unaff_R13 = *(SerialArena **)(in_FS_OFFSET + -0x70);
    s = (anon_union_8_1_898a9ca8_for_TcFieldData_0)this->data;
    puVar16 = (ushort *)ptr;
    if ((s.data & 1) == 0) {
      pcVar8 = (char *)(ulong)((long *)s.data != (long *)0x0);
    }
    else {
      pRVar9 = RepeatedPtrFieldBase::rep((RepeatedPtrFieldBase *)this);
      pcVar8 = (char *)(ulong)(uint)pRVar9->allocated_size;
      lVar13 = extraout_RDX;
    }
    pVar20._8_8_ = lVar13;
    pVar20.first = pcVar8;
    if ((int)pcVar8 != *(int *)(this + 1)) goto LAB_0028ec47;
    do {
      bVar1 = (byte)*puVar19;
      puVar15 = (ushort *)(ulong)bVar1;
      uVar12 = (uint)bVar1;
      if ((char)bVar1 < '\0') {
        pVar20 = (pair<const_char_*,_unsigned_int>)ReadSizeFallback((char *)puVar19,(uint)bVar1);
        puVar19 = (ushort *)pVar20.first;
        uVar12 = pVar20.second;
        puVar16 = puVar15;
      }
      else {
        puVar19 = (ushort *)((long)puVar19 + 1);
      }
      ctx_00 = pVar20._8_8_;
      if (puVar19 == (ushort *)0x0) {
        ptr = (char *)0x0;
      }
      else {
        _Var4 = (unaff_R13->string_block_unused_).super___atomic_base<unsigned_long>._M_i;
        if (_Var4 != 0) {
          v1 = _Var4 - 0x20;
          (unaff_R13->string_block_unused_).super___atomic_base<unsigned_long>._M_i = v1;
          pSVar5 = (unaff_R13->string_block_)._M_b._M_p;
          v2 = (ulong)pSVar5->allocated_size_ - 0x10;
          if (v2 < v1) {
            failure_msg = absl::lts_20250127::log_internal::
                          MakeCheckOpString<unsigned_long,unsigned_long>
                                    (v1,v2,"offset <= effective_size()");
          }
          else {
            failure_msg = (Nonnull<const_char_*>)0x0;
          }
          if (failure_msg != (Nonnull<const_char_*>)0x0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_40,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/string_block.h"
                       ,0xa2,failure_msg);
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_40);
          }
          data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                         ((long)&pSVar5[-1].next_ + _Var4);
        }
        s = data.field_0;
        if (_Var4 == 0) {
          s = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
              SerialArena::AllocateFromStringBlockFallback(unaff_R13);
        }
        *(uint64_t *)s = s.data + 0x10;
        *(undefined8 *)(s.data + 8) = 0;
        *(undefined1 *)(s.data + 0x10) = 0;
        RepeatedPtrFieldBase::AddAllocatedForParse((RepeatedPtrFieldBase *)this,(void *)s);
        ptr = EpsCopyInputStream::ReadString
                        (&ctx->super_EpsCopyInputStream,(char *)puVar19,uVar12,(string *)s);
        ctx_00 = extraout_RDX_00;
        puVar16 = puVar19;
      }
      if ((ushort *)ptr == (ushort *)0x0) {
LAB_0028ed6b:
        pcVar8 = Error(msg,(char *)puVar16,ctx_00,(TcFieldData)s,table,hasbits);
        return pcVar8;
      }
      pVVar10 = RepeatedPtrFieldBase::
                Mutable<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                          ((RepeatedPtrFieldBase *)this,*(int *)(this + 1) + -1);
      puVar16 = (ushort *)(pVVar10->_M_dataplus)._M_p;
      wire_bytes._M_str = (char *)table;
      wire_bytes._M_len = (size_t)puVar16;
      s.data = table_00.data;
      bVar6 = MpVerifyUtf8((TcParser *)pVVar10->_M_string_length,wire_bytes,
                           (TcParseTableBase *)table_00,(FieldEntry *)(ulong)uVar14,(uint16_t)uVar18
                          );
      ctx_00 = extraout_RDX_01;
      if (!bVar6) goto LAB_0028ed6b;
      puVar19 = (ushort *)(ctx->super_EpsCopyInputStream).limit_end_;
      bVar6 = ptr < puVar19;
      if (puVar19 <= ptr) break;
      bVar1 = (byte)*(ushort *)ptr;
      pVar20.second._0_1_ = bVar1;
      pVar20.first = (char *)ctx;
      pVar20._9_7_ = 0;
      puVar19 = (ushort *)((long)ptr + 1);
      if ((char)bVar1 < '\0') {
        bVar2 = *(byte *)puVar19;
        s.data = (ulong)bVar2 << 7;
        uVar12 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
        pVar20 = (pair<const_char_*,_unsigned_int>)(ZEXT416(uVar12) << 0x40);
        if ((char)bVar2 < '\0') {
          puVar16 = (ushort *)(ulong)uVar12;
          pVar20 = ReadTagFallback(ptr,uVar12);
          puVar19 = (ushort *)pVar20.first;
        }
        else {
          puVar19 = (ushort *)((long)ptr + 2);
        }
      }
    } while (pVar20.second == uVar7);
  }
  if (bVar6) {
    if (ptr < (ctx->super_EpsCopyInputStream).limit_end_) {
      uVar7 = (uint)table->fast_idx_mask & (uint)*(ushort *)ptr;
      if ((uVar7 & 7) != 0) {
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x452);
      }
      uVar11 = (ulong)(uVar7 & 0xfffffff8);
      data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                     ((ulong)*(ushort *)ptr ^ *(ulong *)(&table[1].fast_idx_mask + uVar11 * 2));
      UNRECOVERED_JUMPTABLE = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar11);
LAB_0028ea7c:
      pcVar8 = (*UNRECOVERED_JUMPTABLE)(msg,ptr,ctx,data,table,hasbits);
      return pcVar8;
    }
    uVar3 = table->has_bits_offset;
  }
  else {
    uVar3 = table->has_bits_offset;
  }
  if ((ulong)uVar3 != 0) {
    puVar17 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)uVar3);
    if (((ulong)puVar17 & 3) != 0) {
LAB_0028ed8d:
      AlignFail();
    }
    *puVar17 = *puVar17 | (uint)hasbits;
  }
  return (char *)(ushort *)ptr;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpRepeatedString(
    PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint16_t type_card = entry.type_card;
  const uint32_t decoded_tag = data.tag();
  const uint32_t decoded_wiretype = decoded_tag & 7;

  if (decoded_wiretype != WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
    PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
  }

  const uint16_t rep = type_card & field_layout::kRepMask;
  const uint16_t xform_val = type_card & field_layout::kTvMask;
  void* const base = MaybeGetSplitBase(msg, is_split, table);
  switch (rep) {
    case field_layout::kRepSString: {
      auto& field = MaybeCreateRepeatedPtrFieldRefAt<std::string, is_split>(
          base, entry.offset, msg);
      const char* ptr2 = ptr;
      uint32_t next_tag;

      auto* arena = field.GetArena();
      SerialArena* serial_arena;
      if (ABSL_PREDICT_TRUE(arena != nullptr &&
                            arena->impl_.GetSerialArenaFast(&serial_arena) &&
                            field.PrepareForParse())) {
        do {
          ptr = ptr2;
          ptr = ParseRepeatedStringOnce(ptr, serial_arena, ctx, field);
          if (ABSL_PREDICT_FALSE(ptr == nullptr ||
                                 !MpVerifyUtf8(field[field.size() - 1], table,
                                               entry, xform_val))) {
            PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
          }
          if (ABSL_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
          ptr2 = ReadTag(ptr, &next_tag);
        } while (next_tag == decoded_tag);
      } else {
        do {
          ptr = ptr2;
          std::string* str = field.Add();
          ptr = InlineGreedyStringParser(str, ptr, ctx);
          if (ABSL_PREDICT_FALSE(
                  ptr == nullptr ||
                  !MpVerifyUtf8(*str, table, entry, xform_val))) {
            PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
          }
          if (ABSL_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
          ptr2 = ReadTag(ptr, &next_tag);
        } while (next_tag == decoded_tag);
      }

      break;
    }

#ifndef NDEBUG
    default:
      ABSL_LOG(FATAL) << "Unsupported repeated string rep: " << rep;
      break;
#endif
  }

  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
parse_loop:
  PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}